

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0,true>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_bccf3fd9 comp,int bad_allowed,bool leftmost)

{
  char cVar1;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var2;
  anon_class_8_1_bccf3fd9 __comp;
  anon_class_8_1_bccf3fd9 __comp_00;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var7;
  CliqueVar *pCVar8;
  ulong uVar9;
  uchar uVar10;
  size_t i;
  ulong uVar11;
  CliqueVar *pCVar12;
  long lVar13;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var14;
  CliqueVar __tmp_1;
  long lVar15;
  CliqueVar __tmp;
  CliqueVar v2;
  ulong uVar16;
  CliqueVar CVar17;
  CliqueVar CVar18;
  anon_class_8_1_bccf3fd9 local_218;
  CliqueVar local_20c;
  anon_class_8_1_bccf3fd9 comp_local;
  CliqueVar *local_200;
  ulong local_1f8;
  ulong local_1d8;
  CliqueVar *local_1c8;
  int local_1bc;
  CliqueVar *local_1b8;
  long local_1a8;
  long local_1a0;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_198;
  uchar offsets_l_storage [128];
  byte local_81;
  uchar auStack_80 [80];
  
  local_1b8 = end._M_current + -1;
  comp_local.objective = comp.objective;
  local_1bc = bad_allowed;
LAB_0027cfe2:
  do {
    lVar5 = (long)end._M_current - (long)begin._M_current;
    uVar9 = lVar5 >> 2;
    if ((long)uVar9 < 0x18) {
      if ((leftmost & 1U) == 0) {
        offsets_l_storage._0_8_ = comp_local.objective;
        if (begin._M_current != end._M_current) {
          while (pCVar12 = begin._M_current + 1, pCVar12 != end._M_current) {
            CVar17 = *begin._M_current;
            CVar18 = begin._M_current[1];
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,CVar17);
            begin._M_current = pCVar12;
            if (bVar3) {
              do {
                *pCVar12 = CVar17;
                CVar17 = pCVar12[-2];
                pCVar12 = pCVar12 + -1;
                bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                                  ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,CVar17);
              } while (bVar3);
              *pCVar12 = CVar18;
            }
          }
        }
      }
      else {
        offsets_l_storage._0_8_ = comp_local.objective;
        if (begin._M_current != end._M_current) {
          lVar5 = 4;
          _Var7._M_current = begin._M_current;
          while (_Var7._M_current + 1 != end._M_current) {
            CVar17 = *_Var7._M_current;
            CVar18 = _Var7._M_current[1];
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,CVar17);
            lVar15 = lVar5;
            if (bVar3) {
              do {
                lVar13 = lVar15;
                *(CliqueVar *)(&(begin._M_current)->field_0x0 + lVar13) = CVar17;
                _Var14._M_current = begin._M_current;
                if (lVar13 == 4) goto LAB_0027d9fb;
                CVar17 = *(CliqueVar *)(&begin._M_current[-2].field_0x0 + lVar13);
                bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                                  ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,CVar17);
                lVar15 = lVar13 + -4;
              } while (bVar3);
              _Var14._M_current = (CliqueVar *)(&begin._M_current[-1].field_0x0 + lVar13);
LAB_0027d9fb:
              *_Var14._M_current = CVar18;
            }
            lVar5 = lVar5 + 4;
            _Var7._M_current = _Var7._M_current + 1;
          }
        }
      }
      return;
    }
    uVar11 = uVar9 >> 1;
    _Var7._M_current = begin._M_current + uVar11;
    if (uVar9 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                (_Var7,begin,
                 (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  )local_1b8,comp_local);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                (begin,_Var7,
                 (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  )local_1b8,comp_local);
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                (begin._M_current + 1,begin._M_current + (uVar11 - 1),end._M_current + -2,comp_local
                );
      pCVar12 = begin._M_current + uVar11;
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                (begin._M_current + 2,pCVar12 + 1,end._M_current + -3,comp_local);
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                (begin._M_current + (uVar11 - 1),_Var7,pCVar12 + 1,comp_local);
      CVar18 = *begin._M_current;
      *begin._M_current = *pCVar12;
      *pCVar12 = CVar18;
    }
    if (((leftmost & 1U) == 0) &&
       (bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          (&comp_local,begin._M_current[-1],*begin._M_current), !bVar3)) {
      offsets_l_storage._0_8_ = comp_local.objective;
      CVar18 = *begin._M_current;
      lVar5 = 0;
      do {
        lVar15 = lVar5;
        CVar17 = *(CliqueVar *)(&end._M_current[-1].field_0x0 + lVar15);
        bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,CVar17);
        lVar5 = lVar15 + -4;
      } while (bVar3);
      pCVar12 = (CliqueVar *)(&end._M_current[-1].field_0x0 + lVar15);
      _Var7._M_current = begin._M_current;
      v2 = CVar18;
      if (lVar15 + -4 == -4) {
        do {
          if (pCVar12 <= _Var7._M_current) break;
          v2 = _Var7._M_current[1];
          _Var7._M_current = _Var7._M_current + 1;
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,v2);
        } while (!bVar3);
      }
      else {
        do {
          v2 = _Var7._M_current[1];
          _Var7._M_current = _Var7._M_current + 1;
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,v2);
        } while (!bVar3);
      }
      while (_Var7._M_current < pCVar12) {
        *_Var7._M_current = CVar17;
        *pCVar12 = v2;
        do {
          CVar17 = pCVar12[-1];
          pCVar12 = pCVar12 + -1;
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,CVar17);
        } while (bVar3);
        do {
          v2 = _Var7._M_current[1];
          _Var7._M_current = _Var7._M_current + 1;
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            ((anon_class_8_1_bccf3fd9 *)offsets_l_storage,CVar18,v2);
        } while (!bVar3);
      }
      *begin._M_current = CVar17;
      *pCVar12 = CVar18;
      begin._M_current = pCVar12 + 1;
      goto LAB_0027cfe2;
    }
    local_218 = (anon_class_8_1_bccf3fd9)(anon_class_8_1_bccf3fd9)comp_local.objective;
    CVar18 = *begin._M_current;
    lVar15 = 0;
    do {
      lVar13 = lVar15;
      CVar17 = *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar13);
      bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                        (&local_218,CVar17,CVar18);
      lVar15 = lVar13 + 4;
    } while (bVar3);
    pCVar12 = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar13);
    _Var7._M_current = end._M_current;
    if (lVar13 + 4 == 4) {
      do {
        if (_Var7._M_current <= pCVar12) break;
        pCVar8 = _Var7._M_current + -1;
        _Var7._M_current = _Var7._M_current + -1;
        bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          (&local_218,*pCVar8,CVar18);
      } while (!bVar3);
    }
    else {
      do {
        pCVar8 = _Var7._M_current + -1;
        _Var7._M_current = _Var7._M_current + -1;
        bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          (&local_218,*pCVar8,CVar18);
      } while (!bVar3);
    }
    local_200 = pCVar12;
    if (pCVar12 < _Var7._M_current) {
      local_200 = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar13) + 1;
      *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar13) = *_Var7._M_current;
      *_Var7._M_current = CVar17;
      local_1f8 = 0;
      local_1d8 = 0;
      local_1a0 = 0;
      local_1a8 = 0;
      local_1c8 = _Var7._M_current;
      _Var14._M_current = local_200;
      local_20c = CVar18;
      local_198._M_current = _Var7._M_current;
      while (local_200 < local_1c8) {
        uVar16 = (long)local_1c8 - (long)local_200 >> 2;
        uVar11 = uVar16 >> (local_1d8 == 0);
        if (local_1f8 != 0) {
          uVar11 = 0;
        }
        uVar16 = uVar16 - uVar11;
        if (local_1d8 != 0) {
          uVar16 = 0;
        }
        if (uVar11 < 0x40) {
          for (uVar6 = 0; pCVar8 = local_200, uVar11 != uVar6; uVar6 = uVar6 + 1) {
            offsets_l_storage[local_1f8 + 0x38] = (uchar)uVar6;
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,*local_200,CVar18);
            local_1f8 = local_1f8 + !bVar3;
            local_200 = local_200 + 1;
          }
        }
        else {
          pCVar8 = local_200;
          for (uVar11 = 0; CVar18 = local_20c, uVar11 < 0x40; uVar11 = uVar11 + 8) {
            uVar10 = (uchar)uVar11;
            offsets_l_storage[local_1f8 + 0x38] = uVar10;
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11],local_20c);
            CVar18 = local_20c;
            offsets_l_storage[!bVar3 + local_1f8 + 0x38] = uVar10 + '\x01';
            bVar4 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 1],local_20c);
            lVar15 = (ulong)!bVar4 + !bVar3 + local_1f8;
            offsets_l_storage[lVar15 + 0x38] = uVar10 + '\x02';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 2],CVar18);
            lVar15 = (ulong)!bVar3 + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar10 + '\x03';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 3],CVar18);
            lVar15 = (ulong)!bVar3 + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar10 + '\x04';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 4],CVar18);
            lVar15 = (ulong)!bVar3 + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar10 + '\x05';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 5],CVar18);
            lVar15 = (ulong)!bVar3 + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar10 + '\x06';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 6],local_20c);
            lVar15 = (ulong)!bVar3 + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar10 + '\a';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_200[uVar11 + 7],local_20c);
            local_1f8 = (ulong)!bVar3 + lVar15;
            pCVar8 = pCVar8 + 8;
          }
        }
        local_200 = pCVar8;
        if (uVar16 < 0x40) {
          uVar11 = 0;
          while (uVar16 != uVar11) {
            uVar11 = uVar11 + 1;
            auStack_80[local_1d8] = (char)uVar11;
            pCVar8 = local_1c8 + -1;
            local_1c8 = local_1c8 + -1;
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,*pCVar8,CVar18);
            local_1d8 = local_1d8 + bVar3;
          }
        }
        else {
          uVar11 = 0;
          while (CVar18 = local_20c, uVar11 < 0x40) {
            cVar1 = (char)uVar11;
            auStack_80[local_1d8] = cVar1 + '\x01';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-1],local_20c);
            auStack_80[bVar3 + local_1d8] = cVar1 + '\x02';
            bVar4 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-2],CVar18);
            lVar15 = (ulong)bVar4 + bVar3 + local_1d8;
            auStack_80[lVar15] = cVar1 + '\x03';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-3],CVar18);
            lVar15 = (ulong)bVar3 + lVar15;
            auStack_80[lVar15] = cVar1 + '\x04';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-4],CVar18);
            lVar15 = (ulong)bVar3 + lVar15;
            auStack_80[lVar15] = cVar1 + '\x05';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-5],CVar18);
            lVar15 = (ulong)bVar3 + lVar15;
            auStack_80[lVar15] = cVar1 + '\x06';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-6],CVar18);
            lVar15 = (ulong)bVar3 + lVar15;
            auStack_80[lVar15] = cVar1 + '\a';
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,local_1c8[-7],CVar18);
            lVar15 = (ulong)bVar3 + lVar15;
            uVar11 = uVar11 + 8;
            auStack_80[lVar15] = (char)uVar11;
            pCVar8 = local_1c8 + -8;
            local_1c8 = local_1c8 + -8;
            bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                              (&local_218,*pCVar8,CVar18);
            local_1d8 = (ulong)bVar3 + lVar15;
          }
        }
        uVar11 = local_1f8;
        if (local_1d8 < local_1f8) {
          uVar11 = local_1d8;
        }
        lVar15 = local_1a8 + 0x38;
        local_1a8 = local_1a8 + uVar11;
        _Var2._M_current = _Var14._M_current;
        if (local_1f8 <= local_1d8) {
          local_1a8 = 0;
          _Var2._M_current = local_200;
        }
        swap_offsets<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  (_Var14,local_198,offsets_l_storage + lVar15,auStack_80 + local_1a0,uVar11,
                   local_1f8 == local_1d8);
        local_1f8 = local_1f8 - uVar11;
        local_1a0 = local_1a0 + uVar11;
        local_1d8 = local_1d8 - uVar11;
        _Var14._M_current = _Var2._M_current;
        if (local_1d8 == 0) {
          local_1a0 = 0;
          local_198._M_current = local_1c8;
        }
      }
      pCVar8 = local_1c8;
      if (local_1f8 != 0) {
        while (local_200 = pCVar8, local_1f8 != 0) {
          CVar17 = _Var14._M_current[offsets_l_storage[local_1f8 + local_1a8 + 0x37]];
          _Var14._M_current[offsets_l_storage[local_1f8 + local_1a8 + 0x37]] = local_200[-1];
          local_200[-1] = CVar17;
          pCVar8 = local_200 + -1;
          local_1f8 = local_1f8 - 1;
        }
      }
      if (local_1d8 != 0) {
        while (local_1d8 != 0) {
          CVar17 = local_198._M_current[-(ulong)(&local_81)[local_1d8 + local_1a0]];
          local_198._M_current[-(ulong)(&local_81)[local_1d8 + local_1a0]] = *local_200;
          *local_200 = CVar17;
          local_200 = local_200 + 1;
          local_1d8 = local_1d8 - 1;
        }
      }
    }
    __comp.objective = comp_local.objective;
    _Var14._M_current = local_200 + -1;
    *begin._M_current = local_200[-1];
    local_200[-1] = CVar18;
    uVar16 = (long)_Var14._M_current - (long)begin._M_current >> 2;
    uVar11 = (long)end._M_current - (long)local_200 >> 2;
    if (((long)uVar16 < (long)(uVar9 >> 3)) || ((long)uVar11 < (long)(uVar9 >> 3))) {
      local_1bc = local_1bc + -1;
      if (local_1bc == 0) {
        uVar11 = uVar9 - 2 >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>>
                    (begin,uVar11,uVar9,begin._M_current[uVar11],
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1010:22)>
                      )__comp.objective);
          __comp_00 = comp_local;
          bVar3 = uVar11 != 0;
          uVar11 = uVar11 - 1;
        } while (bVar3);
        while (4 < lVar5) {
          CVar18 = *local_1b8;
          *local_1b8 = *begin._M_current;
          lVar5 = lVar5 + -4;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>>
                    (begin,0,lVar5 >> 2,CVar18,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1010:22)>
                      )__comp_00.objective);
          local_1b8 = local_1b8 + -1;
        }
        return;
      }
      if (0x17 < (long)uVar16) {
        CVar18 = *begin._M_current;
        uVar9 = uVar16 & 0xfffffffffffffffc;
        *begin._M_current = *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar9);
        *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar9) = CVar18;
        CVar18 = local_200[-2];
        local_200[-2] = *(CliqueVar *)((long)local_200 + (-4 - uVar9));
        *(CliqueVar *)((long)local_200 + (-4 - uVar9)) = CVar18;
        if (0x80 < uVar16) {
          uVar16 = uVar16 >> 2;
          CVar18 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar16 + 1];
          begin._M_current[uVar16 + 1] = CVar18;
          CVar18 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar16 + 2];
          begin._M_current[uVar16 + 2] = CVar18;
          CVar18 = local_200[-3];
          local_200[-3] = local_200[~uVar16 - 1];
          local_200[~uVar16 - 1] = CVar18;
          CVar18 = local_200[-4];
          local_200[-4] = local_200[-uVar16 + -3];
          local_200[-uVar16 + -3] = CVar18;
        }
      }
      if (0x17 < (long)uVar11) {
        uVar9 = uVar11 & 0xfffffffffffffffc;
        CVar18 = *local_200;
        *local_200 = *(CliqueVar *)(&local_200->field_0x0 + uVar9);
        *(CliqueVar *)(&local_200->field_0x0 + uVar9) = CVar18;
        CVar18 = end._M_current[-1];
        end._M_current[-1] = *(end._M_current - uVar9);
        *(end._M_current - uVar9) = CVar18;
        if (0x80 < uVar11) {
          uVar11 = uVar11 >> 2;
          CVar18 = local_200[1];
          local_200[1] = local_200[uVar11 + 1];
          local_200[uVar11 + 1] = CVar18;
          CVar18 = local_200[2];
          local_200[2] = local_200[uVar11 + 2];
          local_200[uVar11 + 2] = CVar18;
          CVar18 = end._M_current[-2];
          end._M_current[-2] = end._M_current[~uVar11];
          end._M_current[~uVar11] = CVar18;
          CVar18 = end._M_current[-3];
          end._M_current[-3] = end._M_current[-2 - uVar11];
          end._M_current[-2 - uVar11] = CVar18;
        }
      }
    }
    else if (((_Var7._M_current <= pCVar12) &&
             (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                                (begin,_Var14,comp_local), bVar3)) &&
            (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
                               ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                 )local_200,end,comp_local), bVar3)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0,true>
              (begin,_Var14,comp_local,local_1bc,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = local_200;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }